

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

void sym_insert(BuildCtx *ctx,int32_t ofs,char *prefix,char *suffix)

{
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined8 *puVar4;
  int in_ESI;
  long in_RDI;
  ptrdiff_t i;
  char *in_stack_000000e0;
  char *in_stack_000000e8;
  BuildCtx *in_stack_000000f0;
  long local_28;
  
  iVar1 = *(int *)(in_RDI + 0x40);
  *(int *)(in_RDI + 0x40) = iVar1 + 1;
  local_28 = (long)iVar1;
  while ((0 < local_28 && (in_ESI < *(int *)(*(long *)(in_RDI + 0x58) + (local_28 + -1) * 0x10 + 8))
         )) {
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x58) + local_28 * 0x10);
    puVar4 = (undefined8 *)(*(long *)(in_RDI + 0x58) + (local_28 + -1) * 0x10);
    *puVar2 = *puVar4;
    puVar2[1] = puVar4[1];
    local_28 = local_28 + -1;
  }
  *(int *)(*(long *)(in_RDI + 0x58) + local_28 * 0x10 + 8) = in_ESI;
  pcVar3 = sym_decorate(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  *(char **)(*(long *)(in_RDI + 0x58) + local_28 * 0x10) = pcVar3;
  return;
}

Assistant:

static void sym_insert(BuildCtx *ctx, int32_t ofs,
		       const char *prefix, const char *suffix)
{
  ptrdiff_t i = ctx->nsym++;
  while (i > 0) {
    if (ctx->sym[i-1].ofs <= ofs)
      break;
    ctx->sym[i] = ctx->sym[i-1];
    i--;
  }
  ctx->sym[i].ofs = ofs;
  ctx->sym[i].name = sym_decorate(ctx, prefix, suffix);
}